

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

uniformNiv gl4cts::EnhancedLayouts::Utils::getUniformNiv(Functions *gl,GLuint n_rows)

{
  TestError *this;
  
  if (n_rows - 1 < 4) {
    return (&gl->uniform1iv)[(ulong)(n_rows - 1) * 8];
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invalid number of rows",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x335);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

uniformNiv getUniformNiv(const glw::Functions& gl, glw::GLuint n_rows)
{
	uniformNiv result = 0;

	switch (n_rows)
	{
	case 1:
		result = gl.uniform1iv;
		break;
	case 2:
		result = gl.uniform2iv;
		break;
	case 3:
		result = gl.uniform3iv;
		break;
	case 4:
		result = gl.uniform4iv;
		break;
	default:
		TCU_FAIL("Invalid number of rows");
	}

	return result;
}